

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int bcf_subset(bcf_hdr_t *h,bcf1_t *v,int n,int *imap)

{
  byte bVar1;
  int32_t x;
  int iVar2;
  int type;
  long lVar3;
  long lVar4;
  undefined1 *puVar5;
  char *pcVar6;
  uint uVar7;
  int *piVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong *puVar12;
  ulong uVar13;
  size_t __size;
  uint *puVar14;
  uint8_t *ptr_start;
  byte *pbVar15;
  byte *pbVar16;
  byte *pbVar17;
  size_t __n;
  undefined8 uStack_80;
  ulong local_78;
  bcf1_t *local_70;
  undefined1 *local_68;
  undefined8 local_60;
  kstring_t local_58;
  int local_34;
  
  puVar12 = &local_78;
  local_58.l = 0;
  local_58.m = 0;
  local_58.s = (char *)0x0;
  uVar9 = *(ulong *)&v->field_0x10;
  local_34 = n;
  if (n == 0) {
    uVar9 = uVar9 & 0xffffffffff;
  }
  else {
    lVar4 = -(ulong)((uint)(uVar9 >> 0x1b) & 0x1fe0);
    puVar12 = (ulong *)((long)&local_78 + lVar4);
    if ((uVar9 & 0xff00000000) != 0) {
      pbVar17 = (byte *)(v->indiv).s;
      uVar13 = uVar9 >> 0x20 & 0xff;
      puVar14 = (uint *)((long)&local_60 + lVar4 + 4);
      do {
        if ((*pbVar17 & 0xf) == 2) {
          pbVar15 = pbVar17 + 3;
          uVar7 = (uint)*(short *)(pbVar17 + 1);
        }
        else if ((*pbVar17 & 0xf) == 1) {
          pbVar15 = pbVar17 + 2;
          uVar7 = (uint)(char)pbVar17[1];
        }
        else {
          pbVar15 = pbVar17 + 5;
          uVar7 = *(uint *)(pbVar17 + 1);
        }
        puVar14[-7] = uVar7;
        bVar1 = *pbVar15;
        puVar14[-4] = bVar1 & 0xf;
        if (*pbVar15 < 0xf0) {
          pbVar16 = pbVar15 + 1;
          uVar7 = (uint)(*pbVar15 >> 4);
        }
        else if ((pbVar15[1] & 0xf) == 2) {
          uVar7 = (uint)*(short *)(pbVar15 + 2);
          pbVar16 = pbVar15 + 4;
        }
        else if ((pbVar15[1] & 0xf) == 1) {
          uVar7 = (uint)(char)pbVar15[2];
          pbVar16 = pbVar15 + 3;
        }
        else {
          uVar7 = *(uint *)(pbVar15 + 2);
          pbVar16 = pbVar15 + 6;
        }
        puVar14[-6] = uVar7;
        uVar7 = uVar7 << (bcf_type_shift[bVar1 & 0xf] & 0x1f);
        puVar14[-5] = uVar7;
        *(byte **)(puVar14 + -3) = pbVar16;
        *puVar14 = (int)pbVar16 - (int)pbVar17 & 0x7fffffff;
        uVar7 = uVar7 * (uint)(uVar9 >> 0x28);
        pbVar17 = pbVar16 + (int)uVar7;
        puVar14[-1] = uVar7;
        puVar14 = puVar14 + 8;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
    }
    uVar13 = *(ulong *)&v->field_0x10;
    local_68 = (undefined1 *)puVar12;
    local_60 = imap;
    if ((uVar13 & 0xff00000000) != 0) {
      uVar9 = 0;
      local_70 = v;
      do {
        puVar5 = local_68;
        lVar11 = uVar9 * 0x20;
        x = *(int32_t *)(local_68 + lVar11);
        local_78 = uVar9;
        *(undefined8 *)((long)&uStack_80 + lVar4) = 0x11ecfe;
        bcf_enc_int1(&local_58,x);
        iVar2 = *(int *)(puVar5 + lVar11 + 4);
        type = *(int *)(puVar5 + lVar11 + 0xc);
        *(undefined8 *)((long)&uStack_80 + lVar4) = 0x11ed10;
        bcf_enc_size(&local_58,iVar2,type);
        puVar5 = local_68;
        if (0 < local_34) {
          uVar9 = 0;
          piVar8 = local_60;
          do {
            pcVar6 = local_58.s;
            iVar2 = piVar8[uVar9];
            if (-1 < (long)iVar2) {
              __n = (size_t)*(int *)(puVar5 + lVar11 + 8);
              lVar3 = *(long *)(puVar5 + lVar11 + 0x10);
              uVar13 = local_58.l + __n + 1;
              if (local_58.m <= uVar13) {
                uVar13 = uVar13 >> 1 | uVar13;
                uVar13 = uVar13 >> 2 | uVar13;
                uVar13 = uVar13 >> 4 | uVar13;
                uVar13 = uVar13 >> 8 | uVar13;
                __size = (uVar13 >> 0x10 | uVar13) + 1;
                local_58.m = __size;
                *(undefined8 *)((long)&uStack_80 + lVar4) = 0x11ed8f;
                pcVar6 = (char *)realloc(pcVar6,__size);
                piVar8 = local_60;
                if (pcVar6 == (char *)0x0) goto LAB_0011edc4;
              }
              local_58.s = pcVar6;
              pcVar6 = local_58.s + local_58.l;
              *(undefined8 *)((long)&uStack_80 + lVar4) = 0x11edaf;
              memcpy(pcVar6,(void *)((long)iVar2 * __n + lVar3),__n);
              local_58.l = __n + local_58.l;
              local_58.s[local_58.l] = '\0';
              piVar8 = local_60;
            }
LAB_0011edc4:
            uVar9 = uVar9 + 1;
          } while ((uint)n != uVar9);
        }
        uVar9 = local_78 + 1;
        uVar13 = *(ulong *)&local_70->field_0x10;
        v = local_70;
      } while (uVar9 < (uVar13 >> 0x20 & 0xff));
    }
    uVar9 = 0;
    if (0 < local_34) {
      uVar10 = 0;
      do {
        uVar9 = (ulong)(uint)((int)uVar9 - (~local_60[uVar10] >> 0x1f));
        uVar10 = uVar10 + 1;
      } while ((uint)n != uVar10);
      uVar9 = uVar9 << 0x28;
    }
    uVar9 = uVar13 & 0xffffffffff | uVar9;
  }
  *(ulong *)&v->field_0x10 = uVar9;
  if (uVar9 < 0x10000000000) {
    *(ulong *)&v->field_0x10 = uVar9 & 0xffffffff;
  }
  pcVar6 = (v->indiv).s;
  *(undefined8 *)((long)puVar12 + -8) = 0x11ee46;
  free(pcVar6);
  (v->indiv).s = local_58.s;
  (v->indiv).l = local_58.l;
  (v->indiv).m = local_58.m;
  *(byte *)&v->unpacked = (byte)v->unpacked & 0xf7;
  return 0;
}

Assistant:

int bcf_subset(const bcf_hdr_t *h, bcf1_t *v, int n, int *imap)
{
    kstring_t ind;
    ind.s = 0; ind.l = ind.m = 0;
    if (n) {
        bcf_fmt_t *fmt;
        int i, j;
        fmt = (bcf_fmt_t*)alloca(v->n_fmt * sizeof(bcf_fmt_t));
        uint8_t *ptr = (uint8_t*)v->indiv.s;
        for (i = 0; i < v->n_fmt; ++i)
            ptr = bcf_unpack_fmt_core1(ptr, v->n_sample, &fmt[i]);
        for (i = 0; i < (int)v->n_fmt; ++i) {
            bcf_fmt_t *f = &fmt[i];
            bcf_enc_int1(&ind, f->id);
            bcf_enc_size(&ind, f->n, f->type);
            for (j = 0; j < n; ++j)
                if (imap[j] >= 0) kputsn((char*)(f->p + imap[j] * f->size), f->size, &ind);
        }
        for (i = j = 0; j < n; ++j) if (imap[j] >= 0) ++i;
        v->n_sample = i;
    } else v->n_sample = 0;
    if ( !v->n_sample ) v->n_fmt = 0;
    free(v->indiv.s);
    v->indiv = ind;
    v->unpacked &= ~BCF_UN_FMT;    // only BCF is ready for output, VCF will need to unpack again
    return 0;
}